

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterSet.cpp
# Opt level: O1

string * __thiscall
ZXing::NormalizeName_abi_cxx11_(string *__return_storage_ptr__,ZXing *this,string_view sv)

{
  char *pcVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  ulong uVar5;
  int iVar6;
  void *pvVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  size_type sVar11;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sv._M_len,this + sv._M_len,sv._M_str);
  sVar3 = __return_storage_ptr__->_M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar11 = 0;
    do {
      iVar6 = tolower((int)pcVar4[sVar11]);
      pcVar4[sVar11] = (char)iVar6;
      sVar11 = sVar11 + 1;
    } while (sVar3 != sVar11);
  }
  pcVar10 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar5 = __return_storage_ptr__->_M_string_length;
  pcVar1 = pcVar10 + uVar5;
  pcVar8 = pcVar10;
  if (0 < (long)uVar5 >> 2) {
    pcVar8 = pcVar10 + (uVar5 & 0xfffffffffffffffc);
    lVar9 = ((long)uVar5 >> 2) + 1;
    pcVar10 = pcVar10 + 3;
    do {
      pvVar7 = memchr("_-[] ",(int)pcVar10[-3],6);
      if (pvVar7 != (void *)0x0) {
        pcVar10 = pcVar10 + -3;
        goto LAB_0013295e;
      }
      pvVar7 = memchr("_-[] ",(int)pcVar10[-2],6);
      if (pvVar7 != (void *)0x0) {
        pcVar10 = pcVar10 + -2;
        goto LAB_0013295e;
      }
      pvVar7 = memchr("_-[] ",(int)pcVar10[-1],6);
      if (pvVar7 != (void *)0x0) {
        pcVar10 = pcVar10 + -1;
        goto LAB_0013295e;
      }
      pvVar7 = memchr("_-[] ",(int)*pcVar10,6);
      if (pvVar7 != (void *)0x0) goto LAB_0013295e;
      lVar9 = lVar9 + -1;
      pcVar10 = pcVar10 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)pcVar1 - (long)pcVar8;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      pcVar10 = pcVar1;
      if ((lVar9 != 3) ||
         (pvVar7 = memchr("_-[] ",(int)*pcVar8,6), pcVar10 = pcVar8, pvVar7 != (void *)0x0))
      goto LAB_0013295e;
      pcVar8 = pcVar8 + 1;
    }
    pvVar7 = memchr("_-[] ",(int)*pcVar8,6);
    pcVar10 = pcVar8;
    if (pvVar7 != (void *)0x0) goto LAB_0013295e;
    pcVar8 = pcVar8 + 1;
  }
  pvVar7 = memchr("_-[] ",(int)*pcVar8,6);
  pcVar10 = pcVar8;
  if (pvVar7 == (void *)0x0) {
    pcVar10 = pcVar1;
  }
LAB_0013295e:
  pcVar8 = pcVar10 + 1;
  if (pcVar8 != pcVar1 && pcVar10 != pcVar1) {
    do {
      cVar2 = *pcVar8;
      pvVar7 = memchr("_-[] ",(int)cVar2,6);
      if (pvVar7 == (void *)0x0) {
        *pcVar10 = cVar2;
        pcVar10 = pcVar10 + 1;
      }
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 != pcVar1);
  }
  __return_storage_ptr__->_M_string_length =
       (long)pcVar10 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
  *pcVar10 = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string NormalizeName(std::string_view sv)
{
	std::string str(sv);
	std::transform(str.begin(), str.end(), str.begin(), [](char c) { return (char)std::tolower(c); });
	str.erase(std::remove_if(str.begin(), str.end(), [](char c) { return Contains("_-[] ", c); }), str.end());
	return str;
}